

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall
wabt::TypeChecker::PopAndCheck2Types(TypeChecker *this,Type expected1,Type expected2,char *desc)

{
  bool bVar1;
  Result RVar2;
  Result RVar3;
  
  RVar2 = PeekAndCheckType(this,0,expected2);
  RVar3 = PeekAndCheckType(this,1,expected1);
  bVar1 = RVar3.enum_ == Error || RVar2.enum_ == Error;
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = bVar1;
  PrintStackIfFailed<wabt::Type,wabt::Type>(this,RVar2,desc,expected1,expected2);
  RVar2 = DropTypes(this,2);
  RVar3.enum_._1_3_ = 0;
  RVar3.enum_._0_1_ = bVar1 || RVar2.enum_ == Error;
  return (Result)RVar3.enum_;
}

Assistant:

Result TypeChecker::PopAndCheck2Types(Type expected1,
                                      Type expected2,
                                      const char* desc) {
  Result result = Result::Ok;
  result |= PeekAndCheckType(0, expected2);
  result |= PeekAndCheckType(1, expected1);
  PrintStackIfFailed(result, desc, expected1, expected2);
  result |= DropTypes(2);
  return result;
}